

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleForth.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  ostream *poVar2;
  istreambuf_iterator<char,_std::char_traits<char>_> __beg;
  istreambuf_iterator<char,_std::char_traits<char>_> __end;
  char *errorMessage_2;
  AbortException *ex;
  char *errorMessage_1;
  exception *ex_1;
  char *errorMessage;
  AbortException *ex_2;
  string local_b10;
  allocator<char> local_ae9;
  undefined1 local_ae8 [12];
  undefined1 local_ad8 [12];
  undefined1 local_ac8 [8];
  string str;
  ifstream t;
  int local_89c;
  undefined1 local_898 [4];
  int i;
  string res2;
  undefined1 local_870 [8];
  string line;
  string local_848;
  undefined1 local_818 [8];
  Forth forth;
  char **argv_local;
  int argc_local;
  
  forth._2040_8_ = argv;
  cppforth::Forth::Forth((Forth *)local_818);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_848,"",(allocator<char> *)(line.field_2._M_local_buf + 0xf));
  cppforth::Forth::SetExecutionInputBuffer((Forth *)local_818,&local_848);
  std::__cxx11::string::~string((string *)&local_848);
  std::allocator<char>::~allocator((allocator<char> *)(line.field_2._M_local_buf + 0xf));
  cppforth::Forth::setInputSource((Forth *)local_818,FromStdCin);
  cppforth::Forth::setWriteTarget((Forth *)local_818,ToStdCout);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_870," ",(allocator<char> *)(res2.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(res2.field_2._M_local_buf + 0xf));
  std::__cxx11::string::string((string *)local_898);
  for (local_89c = 1; local_89c < argc; local_89c = local_89c + 1) {
    std::ifstream::ifstream
              ((void *)((long)&str.field_2 + 8),*(char **)(forth._2040_8_ + (long)local_89c * 8),
               _S_in);
    std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
              ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_ad8,
               (istream_type *)(str.field_2._M_local_buf + 8));
    std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
              ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_ae8);
    std::allocator<char>::allocator();
    __beg._12_4_ = 0;
    __beg._M_sbuf = (streambuf_type *)local_ad8._0_8_;
    __beg._M_c = local_ad8._8_4_;
    __end._12_4_ = 0;
    __end._M_sbuf = (streambuf_type *)local_ae8._0_8_;
    __end._M_c = local_ae8._8_4_;
    std::__cxx11::string::string<std::istreambuf_iterator<char,std::char_traits<char>>,void>
              ((string *)local_ac8,__beg,__end,&local_ae9);
    std::allocator<char>::~allocator(&local_ae9);
    cppforth::Forth::ExecuteString((Forth *)local_818,(string *)local_ac8);
    cppforth::Forth::ExecutionOutput_abi_cxx11_(&local_b10,(Forth *)local_818);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_898,
               &local_b10);
    std::__cxx11::string::~string((string *)&local_b10);
    cppforth::Forth::ExecutionOutputReset((Forth *)local_818);
    std::__cxx11::string::~string((string *)local_ac8);
    std::ifstream::~ifstream((void *)((long)&str.field_2 + 8));
  }
  while (bVar1 = cppforth::Forth::isFinished((Forth *)local_818), ((bVar1 ^ 0xffU) & 1) != 0) {
    poVar2 = (ostream *)
             std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    std::operator<<(poVar2,">");
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)local_870);
    cppforth::Forth::ExecuteString((Forth *)local_818,(string *)local_870);
    cppforth::Forth::ExecutionOutput_abi_cxx11_((string *)&ex_2,(Forth *)local_818);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_898,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ex_2);
    std::__cxx11::string::~string((string *)&ex_2);
    std::operator<<((ostream *)&std::cout,(string *)local_898);
    cppforth::Forth::ExecutionOutputReset((Forth *)local_818);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_898);
  }
  std::__cxx11::string::~string((string *)local_898);
  std::__cxx11::string::~string((string *)local_870);
  cppforth::Forth::~Forth((Forth *)local_818);
  return 0;
}

Assistant:

int main(int argc, const char** argv) {
	try {
		cppforth::Forth forth{};
		forth.SetExecutionInputBuffer("");
		forth.setInputSource(cppforth::Forth::FromStdCin);
		forth.setWriteTarget(cppforth::Forth::ToStdCout);

		std::string line{ " " }, res2{};
		for(int i=1;i<argc;++i){
			std::ifstream t(argv[i]);
                        std::string str((std::istreambuf_iterator<char>(t)),
                         std::istreambuf_iterator<char>());
			forth.ExecuteString(str);
			res2 = forth.ExecutionOutput();
			forth.ExecutionOutputReset();
		}
		while (!forth.isFinished()){
			std::cout << std::endl << ">" ;
 			std::getline(std::cin, line);
			try {
				forth.ExecuteString(line);
				res2 = forth.ExecutionOutput();
				std::cout << res2;
			}
			catch (cppforth::Forth::AbortException &ex){
				const char *errorMessage = ex.what();
				std::cout << "Forth exception " << errorMessage << std::endl;
			}
			forth.ExecutionOutputReset();
			res2.clear();
		}
	}
	catch (cppforth::Forth::AbortException &ex){
		const char *errorMessage = ex.what();
         	std::cout << "Forth exception "<<errorMessage<<std::endl;
	}
	catch (std::exception &ex){
		const char *errorMessage = ex.what();
         	std::cout << "C++ exception "<<errorMessage<<std::endl;
	}
	catch (...){
         	std::cout << "Unknown C++ exception "<<std::endl;
	}
	return 0;
}